

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool mips_cpu_tlb_fill_mips64
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  int tlb_error;
  int ret;
  int mips_access_type;
  int prot;
  hwaddr physical;
  CPUMIPSState_conflict5 *env;
  MIPSCPU_conflict2 *cpu;
  MMUAccessType MStack_28;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  physical = (hwaddr)(cs[1].tb_jmp_cache + 0x143);
  env = (CPUMIPSState_conflict5 *)cs;
  cpu._3_1_ = probe;
  cpu._4_4_ = mmu_idx;
  MStack_28 = access_type;
  mmu_idx_local = size;
  _access_type_local = address;
  address_local = (vaddr)cs;
  tlb_error = get_physical_address
                        ((CPUMIPSState_conflict5 *)physical,(hwaddr *)&mips_access_type,&ret,address
                         ,access_type,0x20,mmu_idx);
  if (tlb_error == 0) {
    tlb_set_page_mips64((CPUState *)address_local,_access_type_local & 0xfffffffffffff000,
                        _mips_access_type & 0xfffffffffffff000,ret,cpu._4_4_,0x1000);
    cs_local._7_1_ = true;
  }
  else {
    if ((cpu._3_1_ & 1) == 0) {
      raise_mmu_exception((CPUMIPSState_conflict5 *)physical,_access_type_local,MStack_28,tlb_error)
      ;
      do_raise_exception_err_mips64
                ((CPUMIPSState_conflict5 *)physical,*(uint32_t *)(address_local + 0x81a0),
                 *(int *)(physical + 0x3e40),retaddr);
    }
    cs_local._7_1_ = false;
  }
  return cs_local._7_1_;
}

Assistant:

bool mips_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr physical;
    int prot;
    int mips_access_type;
    int ret = TLBRET_BADADDR;

    /* data access */
    /* XXX: put correct access by using cpu_restore_state() correctly */
    mips_access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address,
                               access_type, mips_access_type, mmu_idx);
    switch (ret) {
    case TLBRET_MATCH:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " physical " TARGET_FMT_plx
                      " prot %d\n", __func__, address, physical, prot);
        break;
    default:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " ret %d\n", __func__, address,
                      ret);
        break;
    }
    if (ret == TLBRET_MATCH) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     physical & TARGET_PAGE_MASK, prot,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }
#if !defined(TARGET_MIPS64)
    if ((ret == TLBRET_NOMATCH) && (env->tlb->nb_tlb > 1)) {
        /*
         * Memory reads during hardware page table walking are performed
         * as if they were kernel-mode load instructions.
         */
        int mode = (env->hflags & MIPS_HFLAG_KSU);
        bool ret_walker;
        env->hflags &= ~MIPS_HFLAG_KSU;
        ret_walker = page_table_walk_refill(env, address, access_type, mmu_idx);
        env->hflags |= mode;
        if (ret_walker) {
            ret = get_physical_address(env, &physical, &prot, address,
                                       access_type, mips_access_type, mmu_idx);
            if (ret == TLBRET_MATCH) {
                tlb_set_page(cs, address & TARGET_PAGE_MASK,
                             physical & TARGET_PAGE_MASK, prot,
                             mmu_idx, TARGET_PAGE_SIZE);
                return true;
            }
        }
    }
#endif
    if (probe) {
        return false;
    }

    raise_mmu_exception(env, address, access_type, ret);
    do_raise_exception_err(env, cs->exception_index, env->error_code, retaddr);
}